

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

int loader_impl_load_from_package
              (plugin_manager manager,plugin p,loader_impl impl,char *path,void **handle_ptr)

{
  int iVar1;
  loader_impl_interface iface;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  loader_handle module;
  loader_handle_impl handle_impl_00;
  ulong uVar5;
  undefined8 *puVar6;
  loader_handle_impl handle_impl;
  loader_path subpath;
  
  if ((((impl != (loader_impl)0x0) &&
       (iface = (loader_impl_interface)plugin_iface(p), iface != (loader_impl_interface)0x0)) &&
      (sVar2 = loader_impl_handle_name(manager,path,subpath), 1 < sVar2)) &&
     (iVar1 = loader_impl_initialize(manager,p,impl), iVar1 == 0)) {
    pvVar3 = loader_impl_get_handle(impl,subpath);
    if (pvVar3 == (void *)0x0) {
      uVar4 = vector_size(impl->handle_impl_init_order);
      vector_push_back_empty(impl->handle_impl_init_order);
      module = (*iface->load_from_package)(impl,path);
      if (module == (loader_handle)0x0) {
        while( true ) {
          uVar4 = uVar4 + 1;
          uVar5 = vector_size(impl->handle_impl_init_order);
          if (uVar5 <= uVar4) break;
          puVar6 = (undefined8 *)vector_at(impl->handle_impl_init_order,uVar4);
          loader_impl_destroy_handle((loader_handle_impl)*puVar6);
        }
        vector_pop_back();
      }
      else {
        handle_impl_00 = loader_impl_load_handle(impl,iface,module,subpath,0x1000);
        if (handle_impl_00 != (loader_handle_impl)0x0) {
          handle_impl_00->populated = 1;
          handle_impl = handle_impl_00;
          iVar1 = set_insert(impl->handle_impl_path_map,handle_impl_00->path,handle_impl_00);
          if (iVar1 == 0) {
            iVar1 = set_insert(impl->handle_impl_map,handle_impl_00->module);
            if (iVar1 == 0) {
              iVar1 = (*iface->discover)(impl,handle_impl_00->module,handle_impl_00->ctx);
              if ((iVar1 == 0) &&
                 (iVar1 = loader_impl_handle_register
                                    (manager,impl,subpath,handle_impl_00,handle_ptr), iVar1 == 0)) {
                vector_set(impl->handle_impl_init_order,uVar4,&handle_impl);
                return 0;
              }
              set_remove(impl->handle_impl_map,handle_impl_00->module);
            }
            set_remove(impl->handle_impl_path_map,handle_impl_00->path);
          }
          while( true ) {
            uVar4 = uVar4 + 1;
            uVar5 = vector_size(impl->handle_impl_init_order);
            if (uVar5 <= uVar4) break;
            puVar6 = (undefined8 *)vector_at(impl->handle_impl_init_order,uVar4);
            loader_impl_destroy_handle((loader_handle_impl)*puVar6);
          }
          vector_pop_back(impl->handle_impl_init_order);
          log_write_impl_va("metacall",0x499,"loader_impl_load_from_package",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                            ,3,"Error when loading handle: %s",subpath);
          loader_impl_destroy_handle(handle_impl_00);
        }
      }
    }
    else {
      log_write_impl_va("metacall",0x462,"loader_impl_load_from_package",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,3,"Load from package handle failed, handle with name %s already loaded",
                        subpath);
    }
  }
  return 1;
}

Assistant:

int loader_impl_load_from_package(plugin_manager manager, plugin p, loader_impl impl, const loader_path path, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);
		loader_path subpath;
		size_t init_order;

		if (iface != NULL && loader_impl_handle_name(manager, path, subpath) > 1)
		{
			loader_handle handle;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_get_handle(impl, subpath) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from package handle failed, handle with name %s already loaded", subpath);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_package(impl, path);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, subpath, LOADER_PATH_SIZE);

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, subpath, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", subpath);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}